

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O3

void __thiscall spvtools::opt::IRContext::ForgetUses(IRContext *this,Instruction *inst)

{
  bool bVar1;
  Analysis AVar2;
  
  AVar2 = this->valid_analyses_;
  if ((AVar2 & kAnalysisBegin) != kAnalysisNone) {
    analysis::DefUseManager::EraseUseRecordsOfOperandIds
              ((this->def_use_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl,
               inst);
    AVar2 = this->valid_analyses_;
  }
  if ((AVar2 & kAnalysisDecorations) != kAnalysisNone) {
    bVar1 = spvOpcodeIsDecoration(inst->opcode_);
    AVar2 = this->valid_analyses_;
    if (bVar1) {
      if ((AVar2 & kAnalysisDecorations) == kAnalysisNone) {
        BuildDecorationManager(this);
      }
      analysis::DecorationManager::RemoveDecoration
                ((this->decoration_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
                 .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>.
                 _M_head_impl,inst);
      AVar2 = this->valid_analyses_;
    }
  }
  if ((AVar2 >> 0x10 & 1) != 0) {
    analysis::DebugInfoManager::ClearDebugInfo
              ((this->debug_info_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DebugInfoManager,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_false>.
               _M_head_impl,inst);
  }
  RemoveFromIdToName(this,inst);
  return;
}

Assistant:

void IRContext::ForgetUses(Instruction* inst) {
  if (AreAnalysesValid(kAnalysisDefUse)) {
    get_def_use_mgr()->EraseUseRecordsOfOperandIds(inst);
  }
  if (AreAnalysesValid(kAnalysisDecorations)) {
    if (inst->IsDecoration()) {
      get_decoration_mgr()->RemoveDecoration(inst);
    }
  }
  if (AreAnalysesValid(kAnalysisDebugInfo)) {
    get_debug_info_mgr()->ClearDebugInfo(inst);
  }
  RemoveFromIdToName(inst);
}